

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

bool __thiscall rw::Clump::streamWrite(Clump *this,Stream *stream)

{
  LinkList *pLVar1;
  LinkList *pLVar2;
  LLLink *pLVar3;
  LLLink *pLVar4;
  Clump *pCVar5;
  uint32 uVar6;
  int32 iVar7;
  LLLink *pLVar8;
  int val;
  int size;
  FrameList_ frmlst;
  int32 buf [3];
  FrameList_ local_60;
  Clump *local_50;
  LLLink *local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar6 = streamGetSize(this);
  writeChunkHeader(stream,0x10,uVar6);
  pLVar1 = &this->atomics;
  val = -1;
  pLVar8 = &pLVar1->link;
  do {
    pLVar8 = ((LLLink *)&pLVar8->next)->next;
    val = val + 1;
  } while (pLVar8 != &pLVar1->link);
  pLVar2 = &this->lights;
  local_38 = -1;
  pLVar8 = &pLVar2->link;
  do {
    pLVar8 = ((LLLink *)&pLVar8->next)->next;
    local_38 = local_38 + 1;
  } while (pLVar8 != &pLVar2->link);
  local_48 = &(this->cameras).link;
  local_34 = -1;
  pLVar8 = local_48;
  do {
    pLVar8 = ((LLLink *)&pLVar8->next)->next;
    local_34 = local_34 + 1;
  } while (pLVar8 != local_48);
  uVar6 = (uint)(0x33000 < version) * 8 + 4;
  local_50 = this;
  local_3c = val;
  writeChunkHeader(stream,1,uVar6);
  Stream::write32(stream,&local_3c,uVar6);
  pCVar5 = local_50;
  local_60.numFrames = Frame::count((Frame *)(local_50->object).parent);
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 302"
  ;
  local_60.frames = (Frame **)(*Engine::memfuncs)((long)local_60.numFrames << 3,0x10010);
  makeFrameList((Frame *)(pCVar5->object).parent,local_60.frames);
  FrameList_::streamWrite(&local_60,stream);
  pLVar8 = (pCVar5->atomics).link.next;
  if (0x303ff < version) {
    size = 0x10;
    while (pLVar8 != &pLVar1->link) {
      pLVar3 = pLVar8 + -3;
      pLVar8 = pLVar8->next;
      uVar6 = Geometry::streamGetSize((Geometry *)pLVar3->next);
      size = size + uVar6 + 0xc;
    }
    writeChunkHeader(stream,0x1a,size);
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,val);
    pLVar8 = (pLVar1->link).next;
    if (pLVar8 != &pLVar1->link) {
      do {
        pLVar3 = pLVar8 + -3;
        pLVar8 = pLVar8->next;
        Geometry::streamWrite((Geometry *)pLVar3->next,stream);
      } while (pLVar8 != &pLVar1->link);
      pLVar8 = (pLVar1->link).next;
    }
  }
  if (pLVar8 != &pLVar1->link) {
    do {
      pLVar3 = pLVar8->next;
      Atomic::streamWriteClump((Atomic *)&pLVar8[-6].prev,stream,&local_60);
      pLVar8 = pLVar3;
    } while (pLVar3 != &pLVar1->link);
  }
  pLVar8 = (pLVar2->link).next;
  pLVar3 = local_48;
  while (local_48 = pLVar3, pLVar8 != &pLVar2->link) {
    pLVar3 = pLVar8->next;
    iVar7 = findPointer(pLVar8[-5].next,local_60.frames,local_60.numFrames);
    if (iVar7 < 0) {
      return false;
    }
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar7);
    Light::streamWrite((Light *)&pLVar8[-6].prev,stream);
    pLVar8 = pLVar3;
    pLVar3 = local_48;
  }
  pLVar8 = ((LLLink *)&pLVar3->next)->next;
  while( true ) {
    if (pLVar8 == pLVar3) {
      (*DAT_00149de0)(local_60.frames);
      PluginList::streamWrite((PluginList *)&s_plglist,stream,local_50);
      return true;
    }
    pLVar4 = pLVar8->next;
    iVar7 = findPointer(pLVar8[-0x22].next,local_60.frames,local_60.numFrames);
    if (iVar7 < 0) break;
    writeChunkHeader(stream,1,4);
    Stream::writeI32(stream,iVar7);
    Camera::streamWrite((Camera *)&pLVar8[-0x23].prev,stream);
    pLVar8 = pLVar4;
  }
  return false;
}

Assistant:

bool
Clump::streamWrite(Stream *stream)
{
	int size = this->streamGetSize();
	writeChunkHeader(stream, ID_CLUMP, size);
	int32 numAtomics = this->countAtomics();
	int32 numLights = this->countLights();
	int32 numCameras = this->countCameras();
	int32 buf[3] = { numAtomics, numLights, numCameras };
	size = version > 0x33000 ? 12 : 4;
	writeChunkHeader(stream, ID_STRUCT, size);
	stream->write32(buf, size);

	FrameList_ frmlst;
	frmlst.numFrames = this->getFrame()->count();
	frmlst.frames = (Frame**)rwMalloc(frmlst.numFrames*sizeof(Frame*), MEMDUR_FUNCTION | ID_CLUMP);
	makeFrameList(this->getFrame(), frmlst.frames);
	frmlst.streamWrite(stream);

	if(rw::version >= 0x30400){
		size = 12+4;
		FORLIST(lnk, this->atomics)
			size += 12 + Atomic::fromClump(lnk)->geometry->streamGetSize();
		writeChunkHeader(stream, ID_GEOMETRYLIST, size);
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(numAtomics);	// same as numGeometries
		FORLIST(lnk, this->atomics)
			Atomic::fromClump(lnk)->geometry->streamWrite(stream);
	}

	FORLIST(lnk, this->atomics)
		Atomic::fromClump(lnk)->streamWriteClump(stream, &frmlst);

	FORLIST(lnk, this->lights){
		Light *l = Light::fromClump(lnk);
		int frm = findPointer(l->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		l->streamWrite(stream);
	}

	FORLIST(lnk, this->cameras){
		Camera *c = Camera::fromClump(lnk);
		int frm = findPointer(c->getFrame(), (void**)frmlst.frames, frmlst.numFrames);
		if(frm < 0)
			return false;
		writeChunkHeader(stream, ID_STRUCT, 4);
		stream->writeI32(frm);
		c->streamWrite(stream);
	}

	rwFree(frmlst.frames);

	s_plglist.streamWrite(stream, this);
	return true;
}